

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAccountant::~GlobalMemoryAccountant(GlobalMemoryAccountant *this)

{
  long in_RDI;
  GlobalMemoryAccountant *in_stack_ffffffffffffffe0;
  
  restoreMemoryAllocators(in_stack_ffffffffffffffe0);
  if (*(long **)(in_RDI + 0x18) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x18) + 8))();
  }
  if (*(long **)(in_RDI + 0x20) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x20) + 8))();
  }
  if (*(long **)(in_RDI + 0x28) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x28) + 8))();
  }
  MemoryAccountant::~MemoryAccountant((MemoryAccountant *)0x112baf);
  return;
}

Assistant:

GlobalMemoryAccountant::~GlobalMemoryAccountant()
{
    restoreMemoryAllocators();
    delete mallocAllocator_;
    delete newAllocator_;
    delete newArrayAllocator_;
}